

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

size_t __thiscall helics::Interface::getDestinationTargetCount(Interface *this)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  size_type sVar3;
  string_view jsonString;
  json tvalues;
  
  iVar2 = (*this->mCore->_vptr_Core[0x3f])(this->mCore,(ulong)(uint)(this->handle).hid);
  pcVar1 = *(char **)(CONCAT44(extraout_var,iVar2) + 8);
  if (pcVar1 == (char *)0x0) {
    sVar3 = 0;
  }
  else {
    jsonString._M_str = pcVar1;
    jsonString._M_len = (size_t)&tvalues;
    fileops::loadJsonStr_abi_cxx11_(jsonString);
    if (tvalues.m_data.m_type == array) {
      sVar3 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::size(&tvalues);
    }
    else {
      sVar3 = 1;
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&tvalues.m_data);
  }
  return sVar3;
}

Assistant:

const std::string& Interface::getDestinationTargets() const
{
    return mCore->getDestinationTargets(handle);
}